

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::make_constant_null
          (ParsedIR *this,uint32_t id,uint32_t type,bool add_to_typed_id_set)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  Variant *pVVar5;
  bool *pbVar6;
  CompilerError *this_00;
  uint *puVar7;
  size_t sVar8;
  SPIRConstant *pSVar9;
  ulong uVar10;
  TypedID *this_01;
  TypedID<(spirv_cross::Types)0> local_144;
  SPIRConstant *local_140;
  SPIRConstant *constant_1;
  bool local_12d;
  uint local_12c;
  uint *local_128;
  TypedID<(spirv_cross::Types)0> local_11c;
  ID local_118;
  uint local_114;
  undefined1 local_110 [4];
  uint32_t i_1;
  SmallVector<unsigned_int,_8UL> elements_1;
  bool local_cd;
  uint32_t member_ids;
  uint *local_c8;
  TypedID<(spirv_cross::Types)0> local_bc;
  ID local_b8;
  uint local_b4;
  undefined1 local_b0 [4];
  uint32_t i;
  SmallVector<unsigned_int,_8UL> elements;
  allocator local_61;
  string local_60 [32];
  uint32_t local_40;
  TypedID<(spirv_cross::Types)0> local_3c;
  uint32_t parent_id;
  SPIRConstant *constant;
  SPIRType *local_28;
  SPIRType *constant_type;
  uint32_t local_18;
  uint32_t uStack_14;
  bool add_to_typed_id_set_local;
  uint32_t type_local;
  uint32_t id_local;
  ParsedIR *this_local;
  
  constant_type._7_1_ = add_to_typed_id_set;
  local_18 = type;
  uStack_14 = id;
  _type_local = this;
  local_28 = get<spirv_cross::SPIRType>(this,type);
  if ((local_28->pointer & 1U) == 0) {
    bVar1 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>);
    if (bVar1) {
      bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                        (&(local_28->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      if (bVar1) {
        if ((constant_type._7_1_ & 1) != 0) {
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&constant_1 + 4),uStack_14);
          add_typed_id(this,TypeConstant,constant_1._4_4_);
        }
        pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
        local_140 = variant_set<spirv_cross::SPIRConstant,unsigned_int&>(pVVar5,&local_18);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_144,uStack_14);
        (local_140->super_IVariant).self.id = local_144.id;
        SPIRConstant::make_null(local_140,local_28);
      }
      else {
        sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(local_28->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        elements_1.stack_storage.aligned_char._28_4_ = increase_bound_by(this,(uint32_t)sVar8);
        sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(local_28->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        SmallVector<unsigned_int,_8UL>::SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)local_110,sVar8);
        for (local_114 = 0; uVar10 = (ulong)local_114,
            sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              (&(local_28->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            uVar10 < sVar8; local_114 = local_114 + 1) {
          uVar2 = elements_1.stack_storage.aligned_char._28_4_ + local_114;
          this_01 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (&(local_28->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                               (ulong)local_114);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_01);
          make_constant_null(this,uVar2,uVar3,(bool)(constant_type._7_1_ & 1));
          uVar4 = elements_1.stack_storage.aligned_char._28_4_ + local_114;
          puVar7 = VectorView<unsigned_int>::operator[]
                             ((VectorView<unsigned_int> *)local_110,(ulong)local_114);
          *puVar7 = uVar4;
        }
        if ((constant_type._7_1_ & 1) != 0) {
          TypedID<(spirv_cross::Types)0>::TypedID(&local_118,uStack_14);
          add_typed_id(this,TypeConstant,local_118);
        }
        TypedID<(spirv_cross::Types)0>::TypedID(&local_11c,uStack_14);
        pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                           (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
        local_128 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_110);
        sVar8 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_110);
        local_12c = (uint)sVar8;
        local_12d = false;
        pSVar9 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                           (pVVar5,&local_18,&local_128,&local_12c,&local_12d);
        (pSVar9->super_IVariant).self.id = local_11c.id;
        SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_110);
      }
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->parent_type);
      if (uVar2 == 0) {
        __assert_fail("constant_type.parent_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                      ,0x3ed,
                      "void spirv_cross::ParsedIR::make_constant_null(uint32_t, uint32_t, bool)");
      }
      uVar2 = increase_bound_by(this,1);
      local_40 = uVar2;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->parent_type);
      make_constant_null(this,uVar2,uVar3,(bool)(constant_type._7_1_ & 1));
      pbVar6 = VectorView<bool>::back(&(local_28->array_size_literal).super_VectorView<bool>);
      if ((*pbVar6 & 1U) == 0) {
        elements.stack_storage.aligned_char[0x1b] = '\x01';
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_60,"Array size of OpConstantNull must be a literal.",&local_61);
        CompilerError::CompilerError(this_00,(string *)local_60);
        elements.stack_storage.aligned_char[0x1b] = '\0';
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      puVar7 = VectorView<unsigned_int>::back(&(local_28->array).super_VectorView<unsigned_int>);
      SmallVector<unsigned_int,_8UL>::SmallVector
                ((SmallVector<unsigned_int,_8UL> *)local_b0,(ulong)*puVar7);
      for (local_b4 = 0; uVar4 = local_b4,
          puVar7 = VectorView<unsigned_int>::back(&(local_28->array).super_VectorView<unsigned_int>)
          , uVar2 = local_40, uVar4 < *puVar7; local_b4 = local_b4 + 1) {
        puVar7 = VectorView<unsigned_int>::operator[]
                           ((VectorView<unsigned_int> *)local_b0,(ulong)local_b4);
        *puVar7 = uVar2;
      }
      if ((constant_type._7_1_ & 1) != 0) {
        TypedID<(spirv_cross::Types)0>::TypedID(&local_b8,uStack_14);
        add_typed_id(this,TypeConstant,local_b8);
      }
      TypedID<(spirv_cross::Types)0>::TypedID(&local_bc,uStack_14);
      pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                         (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
      local_c8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_b0);
      sVar8 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_b0);
      member_ids = (uint32_t)sVar8;
      local_cd = false;
      pSVar9 = variant_set<spirv_cross::SPIRConstant,unsigned_int&,unsigned_int*,unsigned_int,bool>
                         (pVVar5,&local_18,&local_c8,&member_ids,&local_cd);
      (pSVar9->super_IVariant).self.id = local_bc.id;
      SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_b0);
    }
  }
  else {
    if ((constant_type._7_1_ & 1) != 0) {
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)((long)&constant + 4),uStack_14);
      add_typed_id(this,TypeConstant,constant._4_4_);
    }
    pVVar5 = VectorView<spirv_cross::Variant>::operator[]
                       (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uStack_14);
    _parent_id = variant_set<spirv_cross::SPIRConstant,unsigned_int&>(pVVar5,&local_18);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,uStack_14);
    (_parent_id->super_IVariant).self.id = local_3c.id;
    SPIRConstant::make_null(_parent_id,local_28);
  }
  return;
}

Assistant:

void ParsedIR::make_constant_null(uint32_t id, uint32_t type, bool add_to_typed_id_set)
{
	auto &constant_type = get<SPIRType>(type);

	if (constant_type.pointer)
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
	else if (!constant_type.array.empty())
	{
		assert(constant_type.parent_type);
		uint32_t parent_id = increase_bound_by(1);
		make_constant_null(parent_id, constant_type.parent_type, add_to_typed_id_set);

		if (!constant_type.array_size_literal.back())
			SPIRV_CROSS_THROW("Array size of OpConstantNull must be a literal.");

		SmallVector<uint32_t> elements(constant_type.array.back());
		for (uint32_t i = 0; i < constant_type.array.back(); i++)
			elements[i] = parent_id;

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else if (!constant_type.member_types.empty())
	{
		uint32_t member_ids = increase_bound_by(uint32_t(constant_type.member_types.size()));
		SmallVector<uint32_t> elements(constant_type.member_types.size());
		for (uint32_t i = 0; i < constant_type.member_types.size(); i++)
		{
			make_constant_null(member_ids + i, constant_type.member_types[i], add_to_typed_id_set);
			elements[i] = member_ids + i;
		}

		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		variant_set<SPIRConstant>(ids[id], type, elements.data(), uint32_t(elements.size()), false).self = id;
	}
	else
	{
		if (add_to_typed_id_set)
			add_typed_id(TypeConstant, id);
		auto &constant = variant_set<SPIRConstant>(ids[id], type);
		constant.self = id;
		constant.make_null(constant_type);
	}
}